

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O2

FT_Error BDF_Face_Init(FT_Stream stream,FT_Face bdfface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  char cVar1;
  FT_Memory memory;
  bdf_font_t *font;
  _bdf_line_func_t p_Var2;
  bdf_glyph_t *pbVar3;
  short sVar4;
  FT_Stream stream_00;
  short sVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  size_t mm;
  ulong *P;
  undefined1 *block;
  bdf_property_t *pbVar9;
  FT_String *pFVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  FT_Bitmap_Size *pFVar14;
  ulong uVar15;
  FT_Pointer pvVar16;
  bdf_property_t *pbVar17;
  byte *pbVar18;
  long lVar19;
  anon_union_8_3_ccdffb78_for_value *paVar20;
  undefined2 *puVar21;
  undefined4 uVar22;
  unsigned_long uVar23;
  ushort uVar24;
  size_t __n;
  long lVar25;
  long lVar26;
  FT_Memory memory_00;
  FT_Long FVar27;
  ulong uVar28;
  long *plVar29;
  bdf_font_t *font_00;
  bool bVar30;
  FT_Error error;
  FT_Error local_dc;
  size_t local_d8;
  FT_Int local_cc;
  _bdf_line_func_t cb;
  char *pcStack_c0;
  char *local_b8;
  char *pcStack_b0;
  ulong *local_a8;
  unsigned_long local_a0;
  undefined1 *local_98;
  FT_Memory local_90;
  FT_Memory local_88;
  ulong local_80;
  size_t local_78 [5];
  FT_Stream local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  memory_00 = bdfface->memory;
  local_dc = FT_Stream_Seek(stream,0);
  if (local_dc != 0) {
    return local_dc;
  }
  local_48 = 0x100000001;
  uStack_40 = 0x800000000;
  error = 0;
  P = (ulong *)ft_mem_alloc(memory_00,0x44078,&error);
  if (error == 0) {
    P[8] = (ulong)&local_48;
    *(undefined2 *)(P + 3) = 0x7fff;
    P[0x880e] = stream->size;
    P[0x880d] = (ulong)memory_00;
    P[0x880b] = 0;
    P[0x8809] = 0;
    P[0x880a] = 0;
    P[0x880c] = (ulong)memory_00;
    local_88 = stream->memory;
    local_78[0] = local_78[0] & 0xffffffff00000000;
    local_cc = face_index;
    local_a8 = P;
    local_90 = memory_00;
    block = (undefined1 *)ft_mem_realloc(local_88,1,0,0x400,(void *)0x0,(FT_Error *)local_78);
    if ((int)local_78[0] == 0) {
      cb = _bdf_parse_start;
      *block = 0;
      local_d8 = CONCAT44(local_d8._4_4_,0x100);
      sVar12 = 0;
      uVar28 = 0;
      lVar25 = 0;
      local_a0 = 1;
      uVar15 = 0x400;
      local_50 = stream;
LAB_00139b77:
      local_80 = uVar15;
      local_98 = block;
      bVar30 = false;
      lVar19 = 0;
      block = local_98;
      do {
        stream_00 = local_50;
        uVar15 = local_80;
        sVar13 = uVar28;
        iVar8 = (int)local_d8;
        while( true ) {
          if (!bVar30) {
            sVar12 = FT_Stream_TryRead(stream_00,block + sVar13,uVar15 - sVar13);
            lVar25 = sVar12 + sVar13;
            sVar13 = 0;
            block = local_98;
          }
          uVar28 = local_80;
          __n = lVar25 - lVar19;
          if ((__n == 0 || lVar25 < lVar19) || (iVar8 != (char)block[lVar19])) break;
          lVar19 = lVar19 + 1;
          iVar8 = 0x100;
          bVar30 = true;
        }
        local_d8 = CONCAT44(local_d8._4_4_,iVar8);
        uVar23 = 0;
        lVar26 = lVar19;
        while( true ) {
          if (lVar25 <= lVar26) {
            if (sVar12 == 0) goto LAB_001399cd;
            if (lVar19 != 0) {
              memmove(block,block + lVar19,__n);
              sVar12 = __n;
              uVar28 = __n;
              lVar25 = lVar19;
              block = local_98;
              uVar15 = local_80;
              goto LAB_00139b77;
            }
            if (0xffff < local_80) {
              local_78[0] = CONCAT44(local_78[0]._4_4_,6);
              goto LAB_001399cd;
            }
            uVar15 = local_80 * 2;
            block = (undefined1 *)
                    ft_mem_realloc(local_88,1,local_80,uVar15,block,(FT_Error *)local_78);
            if ((int)local_78[0] == 0) goto LAB_00139b77;
            goto LAB_001399cd;
          }
          cVar1 = block[lVar26];
          if ((cVar1 == '\n') || (cVar1 == '\r')) break;
          lVar26 = lVar26 + 1;
          uVar23 = uVar23 + 1;
        }
        block[lVar26] = 0;
        uVar28 = sVar13;
        if ((block[lVar19] != '\x1a') && ((block[lVar19] != '#' && (lVar19 < lVar26)))) {
          local_d8 = sVar13;
          iVar8 = (*cb)(block + lVar19,uVar23,local_a0,&cb,local_a8);
          local_78[0] = CONCAT44(local_78[0]._4_4_,iVar8);
          if (iVar8 == -1) {
            iVar8 = (*cb)(block + lVar19,uVar23,local_a0,&cb,local_a8);
            local_78[0] = CONCAT44(local_78[0]._4_4_,iVar8);
          }
          uVar28 = local_d8;
          block = local_98;
          if (iVar8 != 0) break;
        }
        local_a0 = local_a0 + 1;
        block[lVar26] = cVar1;
        lVar19 = lVar26 + 1;
        uVar22 = 0x100;
        if (cVar1 == '\r') {
          uVar22 = 10;
        }
        if (cVar1 == '\n') {
          uVar22 = 0xd;
        }
        local_d8 = CONCAT44(local_d8._4_4_,uVar22);
        bVar30 = true;
      } while( true );
    }
LAB_001399cd:
    ft_mem_free(local_88,block);
    memory_00 = local_90;
    P = local_a8;
    face_index = local_cc;
    error = (int)local_78[0];
    font_00 = (bdf_font_t *)local_a8[7];
    if ((int)local_78[0] == 0) {
      if (font_00 == (bdf_font_t *)0x0) {
        uVar15 = *local_a8;
        if ((uVar15 & 1) != 0) goto LAB_0013a0ba;
        error = 3;
        goto LAB_00139a18;
      }
      if (font_00->spacing != 8) {
        font_00->monowidth = (font_00->bbx).width;
      }
      if (local_a8[1] != font_00->unencoded_used + font_00->glyphs_used) {
        font_00->modified = 1;
      }
      if ((font_00->unencoded_used != 0 || font_00->glyphs_used != 0) && (*(int *)local_a8[8] != 0))
      {
        sVar5 = (short)local_a8[3];
        uVar6 = (int)*(short *)((long)local_a8 + 0x1c) - (int)sVar5;
        if (uVar6 != (font_00->bbx).width) {
          (font_00->bbx).width = (unsigned_short)uVar6;
          font_00->modified = 1;
        }
        if ((font_00->bbx).x_offset != sVar5) {
          (font_00->bbx).x_offset = sVar5;
          font_00->modified = 1;
        }
        sVar5 = *(short *)((long)local_a8 + 0x1e);
        if ((font_00->bbx).ascent != sVar5) {
          (font_00->bbx).ascent = sVar5;
          font_00->modified = 1;
        }
        sVar4 = (short)local_a8[4];
        if ((font_00->bbx).descent != sVar4) {
          (font_00->bbx).descent = sVar4;
          (font_00->bbx).y_offset = -sVar4;
          font_00->modified = 1;
        }
        if ((int)sVar4 + (int)sVar5 != (uint)(font_00->bbx).height) {
          (font_00->bbx).height = (unsigned_short)((int)sVar4 + (int)sVar5);
        }
      }
      uVar15 = *local_a8;
      if ((uVar15 & 1) != 0) {
LAB_0013a0ba:
        if ((uVar15 & 0x20) == 0) {
          error = 0xb9;
        }
        else {
          error = 0xba;
        }
        goto LAB_001399fd;
      }
      uVar23 = font_00->comments_len;
      if (uVar23 != 0) {
        pcVar11 = (char *)ft_mem_realloc(font_00->memory,1,uVar23,uVar23 + 1,font_00->comments,
                                         &error);
        font_00 = (bdf_font_t *)P[7];
        font_00->comments = pcVar11;
        if (error != 0) goto LAB_001399fd;
        pcVar11[font_00->comments_len] = '\0';
        font_00 = (bdf_font_t *)P[7];
      }
    }
    else {
LAB_001399fd:
      bdf_free_font(font_00);
      ft_mem_free(memory_00,(void *)P[7]);
      P[7] = 0;
LAB_00139a18:
      font_00 = (bdf_font_t *)0x0;
    }
LAB_00139a1b:
    _bdf_list_done((_bdf_list_t *)(P + 0x8809));
    ft_mem_free(memory_00,(void *)P[5]);
    P[5] = 0;
    ft_mem_free(memory_00,P);
  }
  else {
    font_00 = (bdf_font_t *)0x0;
    if (P != (ulong *)0x0) goto LAB_00139a1b;
  }
  local_dc = error;
  if ((char)error == -0x50) {
    BDF_Face_Done(bdfface);
    return 2;
  }
  if (error != 0) {
    return error;
  }
  bdfface[1].face_flags = (FT_Long)font_00;
  if ((short)face_index != 0 && 0 < face_index) {
    BDF_Face_Done(bdfface);
    return 6;
  }
  bdfface->num_faces = 1;
  bdfface->face_index = 0;
  *(byte *)&bdfface->face_flags = (byte)bdfface->face_flags | 0x92;
  pbVar9 = bdf_get_font_property(font_00,"SPACING");
  if ((((pbVar9 != (bdf_property_t *)0x0) && (pbVar9->format == 1)) &&
      ((byte *)(pbVar9->value).atom != (byte *)0x0)) &&
     ((uVar6 = (byte)*(pbVar9->value).atom - 0x43, uVar6 < 0x2b &&
      ((0x40100000401U >> ((ulong)uVar6 & 0x3f) & 1) != 0)))) {
    *(byte *)&bdfface->face_flags = (byte)bdfface->face_flags | 4;
  }
  pbVar9 = bdf_get_font_property(font_00,"FAMILY_NAME");
  if ((pbVar9 == (bdf_property_t *)0x0) || ((pbVar9->value).atom == (char *)0x0)) {
    bdfface->family_name = (FT_String *)0x0;
  }
  else {
    pFVar10 = (FT_String *)ft_mem_strdup(memory_00,(pbVar9->value).atom,&local_dc);
    bdfface->family_name = pFVar10;
    if (local_dc != 0) {
      return local_dc;
    }
  }
  error = 0;
  memory = bdfface->memory;
  font = (bdf_font_t *)bdfface[1].face_flags;
  local_b8 = (char *)0x0;
  pcStack_b0 = (char *)0x0;
  cb = (_bdf_line_func_t)0x0;
  pcStack_c0 = (char *)0x0;
  bdfface->style_flags = 0;
  pbVar9 = bdf_get_font_property(font,"SLANT");
  if ((((pbVar9 != (bdf_property_t *)0x0) && (pbVar9->format == 1)) &&
      ((byte *)(pbVar9->value).atom != (byte *)0x0)) &&
     ((uVar6 = (byte)*(pbVar9->value).atom - 0x49, uVar6 < 0x27 &&
      ((0x4100000041U >> ((ulong)uVar6 & 0x3f) & 1) != 0)))) {
    *(byte *)&bdfface->style_flags = (byte)bdfface->style_flags | 1;
    local_b8 = "Italic";
    if ((*(pbVar9->value).atom & 0xdfU) == 0x4f) {
      local_b8 = "Oblique";
    }
  }
  pbVar9 = bdf_get_font_property(font,"WEIGHT_NAME");
  if (((pbVar9 != (bdf_property_t *)0x0) && (pbVar9->format == 1)) &&
     (((byte *)(pbVar9->value).atom != (byte *)0x0 &&
      ((byte)(*(pbVar9->value).atom | 0x20U) == 0x62)))) {
    *(byte *)&bdfface->style_flags = (byte)bdfface->style_flags | 2;
    pcStack_c0 = "Bold";
  }
  pbVar9 = bdf_get_font_property(font,"SETWIDTH_NAME");
  if (((((pbVar9 != (bdf_property_t *)0x0) && (pbVar9->format == 1)) &&
       (pcVar11 = (pbVar9->value).atom, pcVar11 != (char *)0x0)) &&
      ((cVar1 = *pcVar11, cVar1 != '\0' && (cVar1 != 'N')))) && (cVar1 != 'n')) {
    pcStack_b0 = pcVar11;
  }
  pbVar9 = bdf_get_font_property(font,"ADD_STYLE_NAME");
  if (((pbVar9 != (bdf_property_t *)0x0) && (pbVar9->format == 1)) &&
     ((p_Var2 = (_bdf_line_func_t)(pbVar9->value).atom, p_Var2 != (_bdf_line_func_t)0x0 &&
      (((cVar1 = (char)*p_Var2, cVar1 != '\0' && (cVar1 != 'N')) && (cVar1 != 'n')))))) {
    cb = p_Var2;
  }
  FVar27 = 0;
  for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
    local_78[lVar25] = 0;
    if ((&cb)[lVar25] != (_bdf_line_func_t)0x0) {
      sVar12 = strlen((char *)(&cb)[lVar25]);
      local_78[lVar25] = sVar12;
      FVar27 = FVar27 + sVar12 + 1;
    }
  }
  if (FVar27 == 0) {
    cb = (_bdf_line_func_t)anon_var_dwarf_3ba80;
    local_78[0] = 7;
    FVar27 = 8;
  }
  pFVar10 = (FT_String *)ft_mem_alloc(memory,FVar27,&error);
  bdfface->style_name = pFVar10;
  if (error != 0) {
    return error;
  }
  for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
    p_Var2 = (&cb)[lVar25];
    if (p_Var2 != (_bdf_line_func_t)0x0) {
      sVar12 = local_78[lVar25];
      if (pFVar10 != bdfface->style_name) {
        *pFVar10 = ' ';
        pFVar10 = pFVar10 + 1;
      }
      memcpy(pFVar10,p_Var2,sVar12);
      if ((lVar25 == 3) || (lVar25 == 0)) {
        for (sVar13 = 0; sVar12 != sVar13; sVar13 = sVar13 + 1) {
          if (pFVar10[sVar13] == ' ') {
            pFVar10[sVar13] = '-';
          }
        }
      }
      pFVar10 = pFVar10 + sVar12;
    }
  }
  *pFVar10 = '\0';
  local_dc = error;
  if (error != 0) {
    return error;
  }
  bdfface->num_glyphs = font_00->glyphs_size + 1;
  bdfface->num_fixed_sizes = 1;
  pFVar14 = (FT_Bitmap_Size *)ft_mem_realloc(memory_00,0x20,0,1,(void *)0x0,&local_dc);
  bdfface->available_sizes = pFVar14;
  if (local_dc != 0) {
    return local_dc;
  }
  pFVar14->x_ppem = 0;
  pFVar14->y_ppem = 0;
  pFVar14->height = 0;
  pFVar14->width = 0;
  *(undefined4 *)&pFVar14->field_0x4 = 0;
  pFVar14->size = 0;
  lVar25 = font_00->font_ascent;
  if (lVar25 - 0x8000U < 0xffffffffffff0001) {
    bVar30 = lVar25 < 0;
    lVar25 = 0x7fff;
    if (bVar30) {
      lVar25 = -0x7fff;
    }
    font_00->font_ascent = lVar25;
  }
  lVar19 = font_00->font_descent;
  if (lVar19 - 0x8000U < 0xffffffffffff0001) {
    bVar30 = lVar19 < 0;
    lVar19 = 0x7fff;
    if (bVar30) {
      lVar19 = -0x7fff;
    }
    font_00->font_descent = lVar19;
  }
  pFVar14->height = (short)lVar19 + (short)lVar25;
  pbVar9 = bdf_get_font_property(font_00,"AVERAGE_WIDTH");
  if (pbVar9 == (bdf_property_t *)0x0) {
    FVar27 = FT_MulDiv((long)pFVar14->height,2,3);
    sVar5 = (short)FVar27;
  }
  else {
    sVar5 = 0x7fff;
    if (0xfffffffffff6001c < (pbVar9->value).l - 0x4fff2U) {
      lVar25 = (long)((int)(pbVar9->value).l + 5) / 10;
      sVar4 = (short)lVar25;
      sVar5 = -sVar4;
      if (0 < (int)lVar25) {
        sVar5 = sVar4;
      }
    }
  }
  pFVar14->width = sVar5;
  pbVar9 = bdf_get_font_property(font_00,"POINT_SIZE");
  if (pbVar9 == (bdf_property_t *)0x0) {
    uVar15 = font_00->point_size;
    if (uVar15 == 0) {
      FVar27 = (long)pFVar14->width << 6;
    }
    else {
      FVar27 = 0x7fff;
      if (uVar15 < 0x8000) {
        FVar27 = uVar15 << 6;
      }
    }
  }
  else {
    lVar25 = (pbVar9->value).l;
    FVar27 = 0x7fff;
    if (0xfffffffffff5f67a < lVar25 - 0x504c3U) {
      lVar19 = -lVar25;
      if (0 < lVar25) {
        lVar19 = lVar25;
      }
      FVar27 = FT_MulDiv(lVar19,0x70800,0x11a4e);
    }
  }
  pFVar14->size = FVar27;
  pbVar9 = bdf_get_font_property(font_00,"PIXEL_SIZE");
  if (pbVar9 != (bdf_property_t *)0x0) {
    iVar7 = (int)(pbVar9->value).l;
    iVar8 = -iVar7;
    if (0 < iVar7) {
      iVar8 = iVar7;
    }
    uVar15 = 0x1fffc0;
    if (0xffffffffffff0000 < (pbVar9->value).l - 0x8000U) {
      uVar15 = (ulong)(uint)(iVar8 << 6);
    }
    pFVar14->y_ppem = uVar15;
  }
  pbVar9 = bdf_get_font_property(font_00,"RESOLUTION_X");
  paVar20 = &pbVar9->value;
  if (pbVar9 == (bdf_property_t *)0x0) {
    paVar20 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_x;
  }
  lVar25 = paVar20->l;
  if (lVar25 == 0) {
    uVar24 = 0;
  }
  else {
    uVar24 = 0x7fff;
    if (0xffffffffffff0000 < lVar25 - 0x8000U) {
      uVar24 = -(ushort)lVar25;
      if (0 < (int)lVar25) {
        uVar24 = (ushort)lVar25;
      }
    }
  }
  pbVar9 = bdf_get_font_property(font_00,"RESOLUTION_Y");
  paVar20 = &pbVar9->value;
  if (pbVar9 == (bdf_property_t *)0x0) {
    paVar20 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_y;
  }
  uVar15 = paVar20->l;
  if (uVar15 == 0) {
    uVar28 = 0;
  }
  else {
    uVar28 = 0x7fff;
    if ((0xffffffffffff0000 < uVar15 - 0x8000) &&
       (uVar28 = (ulong)(uint)-(int)uVar15, 0 < (int)uVar15)) {
      uVar28 = uVar15 & 0xffffffff;
    }
  }
  FVar27 = pFVar14->y_ppem;
  if (FVar27 == 0) {
    FVar27 = pFVar14->size;
    pFVar14->y_ppem = FVar27;
    if ((short)uVar28 == 0) goto LAB_0013a38b;
    FVar27 = FT_MulDiv(FVar27,uVar28 & 0xffff,0x48);
    pFVar14->y_ppem = FVar27;
  }
  if ((uVar24 != 0) && ((short)uVar28 != 0)) {
    FVar27 = FT_MulDiv(FVar27,(ulong)uVar24,uVar28 & 0xffff);
  }
LAB_0013a38b:
  pFVar14->x_ppem = FVar27;
  pbVar3 = font_00->glyphs;
  pvVar16 = ft_mem_realloc(memory_00,0x10,0,font_00->glyphs_size,(void *)0x0,&local_dc);
  bdfface[1].style_flags = (FT_Long)pvVar16;
  if (local_dc == 0) {
    bdfface[1].num_fixed_sizes = 0;
    uVar15 = font_00->glyphs_size;
    puVar21 = (undefined2 *)((long)pvVar16 + 8);
    plVar29 = &pbVar3->encoding;
    for (uVar28 = 0; uVar15 != uVar28; uVar28 = uVar28 + 1) {
      lVar25 = *plVar29;
      *(long *)(puVar21 + -4) = lVar25;
      *puVar21 = (short)uVar28;
      if ((uVar28 < 0xffffffff) && (lVar25 == font_00->default_char)) {
        bdfface[1].num_fixed_sizes = (FT_Int)uVar28;
      }
      puVar21 = puVar21 + 8;
      plVar29 = plVar29 + 7;
    }
    pbVar9 = bdf_get_font_property(font_00,"CHARSET_REGISTRY");
    pbVar17 = bdf_get_font_property(font_00,"CHARSET_ENCODING");
    if ((((pbVar17 == (bdf_property_t *)0x0 || pbVar9 == (bdf_property_t *)0x0) ||
         (pbVar9->format != 1)) || (pbVar17->format != 1)) ||
       (((pbVar9->value).atom == (char *)0x0 || ((pbVar17->value).atom == (char *)0x0)))) {
      pcStack_c0 = (char *)0x741444f42;
      cb = (_bdf_line_func_t)bdfface;
      local_dc = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)&cb,(FT_CMap_conflict *)0x0
                            );
      if (bdfface->num_charmaps != 0) {
        bdfface->charmap = *bdfface->charmaps;
      }
    }
    else {
      pvVar16 = ft_mem_strdup(memory_00,(pbVar17->value).atom,&local_dc);
      bdfface[1].num_faces = (FT_Long)pvVar16;
      if (local_dc == 0) {
        pbVar18 = (byte *)ft_mem_strdup(memory_00,(pbVar9->value).atom,&local_dc);
        bdfface[1].face_index = (FT_Long)pbVar18;
        if (local_dc == 0) {
          bVar30 = true;
          if ((((*pbVar18 | 0x20) == 0x69) && ((pbVar18[1] | 0x20) == 0x73)) &&
             ((pbVar18[2] | 0x20) == 0x6f)) {
            pbVar18 = pbVar18 + 3;
            iVar8 = strcmp((char *)pbVar18,"10646");
            if ((iVar8 == 0) ||
               (((iVar8 = strcmp((char *)pbVar18,"8859"), iVar8 == 0 &&
                 (*(char *)bdfface[1].num_faces == '1')) &&
                (((char *)bdfface[1].num_faces)[1] == '\0')))) {
              bVar30 = false;
            }
            else {
              iVar8 = strcmp((char *)pbVar18,"646.1991");
              if (iVar8 == 0) {
                iVar8 = strcmp((char *)bdfface[1].num_faces,"IRV");
                bVar30 = iVar8 != 0;
              }
            }
          }
          pcStack_c0 = (char *)0x0;
          if (!bVar30) {
            pcStack_c0 = (char *)0x10003756e6963;
          }
          cb = (_bdf_line_func_t)bdfface;
          local_dc = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)&cb,
                                 (FT_CMap_conflict *)0x0);
        }
      }
    }
  }
  return local_dc;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Face_Init( FT_Stream      stream,
                 FT_Face        bdfface,        /* BDF_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    FT_Error       error  = FT_Err_Ok;
    BDF_Face       face   = (BDF_Face)bdfface;
    FT_Memory      memory = FT_FACE_MEMORY( face );

    bdf_font_t*    font = NULL;
    bdf_options_t  options;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "BDF driver\n" ));

    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    options.correct_metrics = 1;   /* FZ XXX: options semantics */
    options.keep_unencoded  = 1;
    options.keep_comments   = 0;
    options.font_spacing    = BDF_PROPORTIONAL;

    error = bdf_load_font( stream, memory, &options, &font );
    if ( FT_ERR_EQ( error, Missing_Startfont_Field ) )
    {
      FT_TRACE2(( "  not a BDF file\n" ));
      goto Fail;
    }
    else if ( error )
      goto Exit;

    /* we have a bdf font: let's construct the face object */
    face->bdffont = font;

    /* BDF cannot have multiple faces in a single font file.
     * XXX: non-zero face_index is already invalid argument, but
     *      Type1, Type42 driver has a convention to return
     *      an invalid argument error when the font could be
     *      opened by the specified driver.
     */
    if ( face_index > 0 && ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "BDF_Face_Init: invalid face index\n" ));
      BDF_Face_Done( bdfface );
      return FT_THROW( Invalid_Argument );
    }

    {
      bdf_property_t*  prop = NULL;


      FT_TRACE4(( "  number of glyphs: allocated %d (used %d)\n",
                  font->glyphs_size,
                  font->glyphs_used ));
      FT_TRACE4(( "  number of unencoded glyphs: allocated %d (used %d)\n",
                  font->unencoded_size,
                  font->unencoded_used ));

      bdfface->num_faces  = 1;
      bdfface->face_index = 0;

      bdfface->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                             FT_FACE_FLAG_HORIZONTAL  |
                             FT_FACE_FLAG_FAST_GLYPHS;

      prop = bdf_get_font_property( font, "SPACING" );
      if ( prop && prop->format == BDF_ATOM                             &&
           prop->value.atom                                             &&
           ( *(prop->value.atom) == 'M' || *(prop->value.atom) == 'm' ||
             *(prop->value.atom) == 'C' || *(prop->value.atom) == 'c' ) )
        bdfface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* FZ XXX: TO DO: FT_FACE_FLAGS_VERTICAL   */
      /* FZ XXX: I need a font to implement this */

      prop = bdf_get_font_property( font, "FAMILY_NAME" );
      if ( prop && prop->value.atom )
      {
        if ( FT_STRDUP( bdfface->family_name, prop->value.atom ) )
          goto Exit;
      }
      else
        bdfface->family_name = NULL;

      if ( FT_SET_ERROR( bdf_interpret_style( face ) ) )
        goto Exit;

      /* the number of glyphs (with one slot for the undefined glyph */
      /* at position 0 and all unencoded glyphs)                     */
      bdfface->num_glyphs = (FT_Long)( font->glyphs_size + 1 );

      bdfface->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( bdfface->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = bdfface->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;
        long             value;


        FT_ZERO( bsize );

        /* sanity checks */
        if ( font->font_ascent > 0x7FFF || font->font_ascent < -0x7FFF )
        {
          font->font_ascent = font->font_ascent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font ascent to value %d\n",
                      font->font_ascent ));
        }
        if ( font->font_descent > 0x7FFF || font->font_descent < -0x7FFF )
        {
          font->font_descent = font->font_descent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font descent to value %d\n",
                      font->font_descent ));
        }

        bsize->height = (FT_Short)( font->font_ascent + font->font_descent );

        prop = bdf_get_font_property( font, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative average width\n" ));
#endif
          if ( prop->value.l >    0x7FFFL * 10 - 5   ||
               prop->value.l < -( 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = bdf_get_font_property( font, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( prop->value.l >  0x504C2L || /* 0x7FFF * 72270/7200 */
               prop->value.l < -0x504C2L )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }
        else if ( font->point_size )
        {
          if ( font->point_size > 0x7FFF )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = (FT_Pos)font->point_size << 6;
        }
        else
        {
          /* this is a heuristical value */
          bsize->size = bsize->width * 64;
        }

        prop = bdf_get_font_property( font, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative pixel size\n" ));
#endif
          if ( prop->value.l > 0x7FFF || prop->value.l < -0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "BDF_Face_Init: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = bdf_get_font_property( font, "RESOLUTION_X" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_x;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative X resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)value );
        }

        prop = bdf_get_font_property( font, "RESOLUTION_Y" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_y;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative Y resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)value );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* encoding table */
      {
        bdf_glyph_t*   cur = font->glyphs;
        unsigned long  n;


        if ( FT_NEW_ARRAY( face->en_table, font->glyphs_size ) )
          goto Exit;

        face->default_glyph = 0;
        for ( n = 0; n < font->glyphs_size; n++ )
        {
          (face->en_table[n]).enc = cur[n].encoding;
          FT_TRACE4(( "  idx %d, val 0x%lX\n", n, cur[n].encoding ));
          (face->en_table[n]).glyph = (FT_UShort)n;

          if ( cur[n].encoding == font->default_char )
          {
            if ( n < FT_UINT_MAX )
              face->default_glyph = (FT_UInt)n;
            else
              FT_TRACE1(( "BDF_Face_Init:"
                          " idx %d is too large for this system\n", n ));
          }
        }
      }

      /* charmaps */
      {
        bdf_property_t  *charset_registry, *charset_encoding;
        FT_Bool          unicode_charmap  = 0;


        charset_registry =
          bdf_get_font_property( font, "CHARSET_REGISTRY" );
        charset_encoding =
          bdf_get_font_property( font, "CHARSET_ENCODING" );
        if ( charset_registry && charset_encoding )
        {
          if ( charset_registry->format == BDF_ATOM &&
               charset_encoding->format == BDF_ATOM &&
               charset_registry->value.atom         &&
               charset_encoding->value.atom         )
          {
            const char*  s;


            if ( FT_STRDUP( face->charset_encoding,
                            charset_encoding->value.atom ) ||
                 FT_STRDUP( face->charset_registry,
                            charset_registry->value.atom ) )
              goto Exit;

            /* Uh, oh, compare first letters manually to avoid dependency */
            /* on locales.                                                */
            s = face->charset_registry;
            if ( ( s[0] == 'i' || s[0] == 'I' ) &&
                 ( s[1] == 's' || s[1] == 'S' ) &&
                 ( s[2] == 'o' || s[2] == 'O' ) )
            {
              s += 3;
              if ( !ft_strcmp( s, "10646" )                      ||
                   ( !ft_strcmp( s, "8859" ) &&
                     !ft_strcmp( face->charset_encoding, "1" ) ) )
                unicode_charmap = 1;
              /* another name for ASCII */
              else if ( !ft_strcmp( s, "646.1991" )                 &&
                        !ft_strcmp( face->charset_encoding, "IRV" ) )
                unicode_charmap = 1;
            }

            {
              FT_CharMapRec  charmap;


              charmap.face        = FT_FACE( face );
              charmap.encoding    = FT_ENCODING_NONE;
              /* initial platform/encoding should indicate unset status? */
              charmap.platform_id = TT_PLATFORM_APPLE_UNICODE;
              charmap.encoding_id = TT_APPLE_ID_DEFAULT;

              if ( unicode_charmap )
              {
                charmap.encoding    = FT_ENCODING_UNICODE;
                charmap.platform_id = TT_PLATFORM_MICROSOFT;
                charmap.encoding_id = TT_MS_ID_UNICODE_CS;
              }

              error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );
            }

            goto Exit;
          }
        }

        /* otherwise assume Adobe standard encoding */

        {
          FT_CharMapRec  charmap;


          charmap.face        = FT_FACE( face );
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.platform_id = TT_PLATFORM_ADOBE;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;

          error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );

          /* Select default charmap */
          if ( bdfface->num_charmaps )
            bdfface->charmap = bdfface->charmaps[0];
        }
      }
    }

  Exit:
    return error;

  Fail:
    BDF_Face_Done( bdfface );
    return FT_THROW( Unknown_File_Format );
  }